

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O2

ostream * foxxll::operator<<(ostream *o,stats *s)

{
  stats_data local_60;
  
  stats_data::stats_data(&local_60,s);
  operator<<(o,&local_60);
  std::_Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>::
  ~_Vector_base(&local_60.file_stats_data_list_.
                 super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
               );
  return o;
}

Assistant:

std::ostream& operator << (std::ostream& o, const stats& s)
{
    o << stats_data(s);
    return o;
}